

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::TreeNodeBehaviorIsOpen(ImGuiID id,ImGuiTreeNodeFlags flags)

{
  ImGuiWindow *pIVar1;
  ImGuiStorage *this;
  ImGuiContext *pIVar2;
  int iVar3;
  byte bVar4;
  byte bVar5;
  
  pIVar2 = GImGui;
  if (((uint)flags >> 8 & 1) == 0) {
    pIVar1 = GImGui->CurrentWindow;
    this = (pIVar1->DC).StateStorage;
    if (GImGui->NextTreeNodeOpenCond == 0) {
      iVar3 = ImGuiStorage::GetInt(this,id,(uint)flags >> 5 & 1);
      bVar5 = iVar3 != 0;
    }
    else {
      if (((GImGui->NextTreeNodeOpenCond & 1U) == 0) &&
         (iVar3 = ImGuiStorage::GetInt(this,id,-1), iVar3 != -1)) {
        bVar5 = iVar3 != 0;
      }
      else {
        bVar5 = pIVar2->NextTreeNodeOpenVal;
        ImGuiStorage::SetInt(this,id,(uint)bVar5);
      }
      pIVar2->NextTreeNodeOpenCond = 0;
    }
    bVar4 = bVar5;
    if ((((flags & 0x10U) == 0) && (pIVar2->LogEnabled != false)) &&
       (bVar4 = 1, pIVar2->LogAutoExpandMaxDepth <= (pIVar1->DC).TreeDepth)) {
      bVar4 = bVar5;
    }
    return (bool)bVar4;
  }
  return true;
}

Assistant:

bool ImGui::TreeNodeBehaviorIsOpen(ImGuiID id, ImGuiTreeNodeFlags flags)
{
    if (flags & ImGuiTreeNodeFlags_Leaf)
        return true;

    // We only write to the tree storage if the user clicks (or explicitly use SetNextTreeNode*** functions)
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiStorage* storage = window->DC.StateStorage;

    bool is_open;
    if (g.NextTreeNodeOpenCond != 0)
    {
        if (g.NextTreeNodeOpenCond & ImGuiCond_Always)
        {
            is_open = g.NextTreeNodeOpenVal;
            storage->SetInt(id, is_open);
        }
        else
        {
            // We treat ImGuiCond_Once and ImGuiCond_FirstUseEver the same because tree node state are not saved persistently.
            const int stored_value = storage->GetInt(id, -1);
            if (stored_value == -1)
            {
                is_open = g.NextTreeNodeOpenVal;
                storage->SetInt(id, is_open);
            }
            else
            {
                is_open = stored_value != 0;
            }
        }
        g.NextTreeNodeOpenCond = 0;
    }
    else
    {
        is_open = storage->GetInt(id, (flags & ImGuiTreeNodeFlags_DefaultOpen) ? 1 : 0) != 0;
    }

    // When logging is enabled, we automatically expand tree nodes (but *NOT* collapsing headers.. seems like sensible behavior).
    // NB- If we are above max depth we still allow manually opened nodes to be logged.
    if (g.LogEnabled && !(flags & ImGuiTreeNodeFlags_NoAutoOpenOnLog) && window->DC.TreeDepth < g.LogAutoExpandMaxDepth)
        is_open = true;

    return is_open;
}